

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FixSrcList(DbFixer *pFix,SrcList *pList)

{
  char *zRight;
  char *zLeft;
  int iVar1;
  SrcList_item *pSVar2;
  int iVar3;
  
  if ((pList != (SrcList *)0x0) && (0 < pList->nSrc)) {
    zRight = pFix->zDb;
    pSVar2 = pList->a;
    iVar3 = 0;
    do {
      if (pFix->bVarOnly == 0) {
        zLeft = pSVar2->zDatabase;
        if (zLeft != (char *)0x0) {
          iVar1 = sqlite3StrICmp(zLeft,zRight);
          if (iVar1 != 0) {
            sqlite3ErrorMsg(pFix->pParse,"%s %T cannot reference objects in database %s",pFix->zType
                            ,pFix->pName,zLeft);
            return 1;
          }
          if (zLeft != (char *)0x0) {
            sqlite3DbFreeNN(pFix->pParse->db,zLeft);
          }
        }
        pSVar2->zDatabase = (char *)0x0;
        pSVar2->pSchema = pFix->pSchema;
      }
      iVar1 = sqlite3FixSelect(pFix,pSVar2->pSelect);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = sqlite3FixExpr(pFix,pSVar2->pOn);
      if (iVar1 != 0) {
        return 1;
      }
      iVar3 = iVar3 + 1;
      pSVar2 = pSVar2 + 1;
    } while (iVar3 < pList->nSrc);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSrcList(
  DbFixer *pFix,       /* Context of the fixation */
  SrcList *pList       /* The Source list to check and modify */
){
  int i;
  const char *zDb;
  struct SrcList_item *pItem;

  if( NEVER(pList==0) ) return 0;
  zDb = pFix->zDb;
  for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
    if( pFix->bVarOnly==0 ){
      if( pItem->zDatabase && sqlite3StrICmp(pItem->zDatabase, zDb) ){
        sqlite3ErrorMsg(pFix->pParse,
            "%s %T cannot reference objects in database %s",
            pFix->zType, pFix->pName, pItem->zDatabase);
        return 1;
      }
      sqlite3DbFree(pFix->pParse->db, pItem->zDatabase);
      pItem->zDatabase = 0;
      pItem->pSchema = pFix->pSchema;
    }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_TRIGGER)
    if( sqlite3FixSelect(pFix, pItem->pSelect) ) return 1;
    if( sqlite3FixExpr(pFix, pItem->pOn) ) return 1;
#endif
  }
  return 0;
}